

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Promise<unsigned_long> __thiscall
kj::AsyncIoStreamWithInitialBuffer::tryRead
          (AsyncIoStreamWithInitialBuffer *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  long *plVar1;
  long lVar2;
  undefined8 uVar3;
  Fault node;
  unsigned_long *in_R8;
  size_t bytesToCopy;
  unsigned_long *__n;
  Fault f;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  Fault local_80;
  unsigned_long *local_78;
  size_t local_70;
  AsyncIoStreamWithInitialBuffer *local_68;
  DebugComparison<unsigned_long_&,_unsigned_long_&> local_60;
  anon_class_8_1_0bacd73b_for_func local_38;
  
  local_60.right = &local_70;
  local_60.left = (unsigned_long *)&local_78;
  local_60.op.content.ptr = " >= ";
  local_60.op.content.size_ = 5;
  local_60.result = maxBytes <= in_R8;
  local_70 = maxBytes;
  if (local_60.result) {
    __n = *(unsigned_long **)((long)buffer + 0x40);
    if (__n < maxBytes) {
      local_78 = in_R8;
      if (__n != (unsigned_long *)0x0) {
        local_68 = this;
        memcpy((void *)minBytes,*(void **)((long)buffer + 0x38),(size_t)__n);
        *(undefined8 *)((long)buffer + 0x38) = 0;
        *(undefined8 *)((long)buffer + 0x40) = 0;
        lVar2 = *(long *)((long)buffer + 0x20);
        if (lVar2 != 0) {
          uVar3 = *(undefined8 *)((long)buffer + 0x28);
          *(undefined8 *)((long)buffer + 0x20) = 0;
          *(undefined8 *)((long)buffer + 0x28) = 0;
          (**(code **)**(undefined8 **)((long)buffer + 0x30))
                    (*(undefined8 **)((long)buffer + 0x30),lVar2,1,uVar3,uVar3,0);
          maxBytes = local_70;
          in_R8 = local_78;
        }
        local_70 = maxBytes - (long)__n;
        local_78 = (unsigned_long *)((long)in_R8 - (long)__n);
        this = local_68;
      }
      (**(code **)(**(long **)((long)buffer + 0x18) + 8))
                (&local_80,*(long **)((long)buffer + 0x18),minBytes + (long)__n,local_70,local_78);
      local_60.left =
           (unsigned_long *)
           kj::_::
           SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:4593:17)>
           ::anon_class_8_1_0bacd73b_for_func::operator();
      local_38.bytesToCopy = (size_t)__n;
      kj::_::PromiseDisposer::
      appendPromise<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::AsyncIoStreamWithInitialBuffer::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_>,kj::_::PromiseDisposer,kj::AsyncIoStreamWithInitialBuffer::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_,void*&>
                ((PromiseDisposer *)this,(OwnPromiseNode *)&local_80,&local_38,&local_60.left);
      node.exception = local_80.exception;
      if (local_80.exception != (Exception *)0x0) {
        local_80.exception = (Exception *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.exception);
      }
    }
    else {
      if (in_R8 < __n) {
        __n = in_R8;
      }
      memcpy((void *)minBytes,*(void **)((long)buffer + 0x38),(size_t)__n);
      *(long *)((long)buffer + 0x38) = *(long *)((long)buffer + 0x38) + (long)__n;
      plVar1 = (long *)((long)buffer + 0x40);
      *plVar1 = *plVar1 - (long)__n;
      if ((*plVar1 == 0) && (lVar2 = *(long *)((long)buffer + 0x20), lVar2 != 0)) {
        uVar3 = *(undefined8 *)((long)buffer + 0x28);
        *(undefined8 *)((long)buffer + 0x20) = 0;
        *(undefined8 *)((long)buffer + 0x28) = 0;
        (**(code **)**(undefined8 **)((long)buffer + 0x30))
                  (*(undefined8 **)((long)buffer + 0x30),lVar2,1,uVar3,uVar3,0);
      }
      local_60.left = __n;
      kj::_::PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<unsigned_long>,kj::_::PromiseDisposer,unsigned_long>
                ((PromiseDisposer *)this,(unsigned_long *)&local_60);
    }
    return (Promise<unsigned_long>)(PromiseNode *)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x11cf,FAILED,"maxBytes >= minBytes","_kjCondition,",&local_60);
  kj::_::Debug::Fault::fatal(&local_80);
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_REQUIRE(maxBytes >= minBytes);
    auto destination = static_cast<byte*>(buffer);

    // If there are at least minBytes available in the leftover buffer...
    if (leftover.size() >= minBytes) {
      // We are going to immediately read up to maxBytes from the leftover buffer...
      auto bytesToCopy = kj::min(maxBytes, leftover.size());
      memcpy(destination, leftover.begin(), bytesToCopy);
      leftover = leftover.slice(bytesToCopy, leftover.size());

      // If we've consumed all of the data in the leftover buffer, go ahead and free it.
      if (leftover.size() == 0) {
        leftoverBackingBuffer = nullptr;
      }

      return bytesToCopy;
    } else {
      // We know here that leftover.size() is less than minBytes, but it might not
      // be zero. Copy everything from leftover into the destination buffer then read
      // the rest from the underlying stream.
      auto bytesToCopy = leftover.size();
      KJ_DASSERT(bytesToCopy < minBytes);

      if (bytesToCopy > 0) {
        memcpy(destination, leftover.begin(), bytesToCopy);
        leftover = nullptr;
        leftoverBackingBuffer = nullptr;
        minBytes -= bytesToCopy;
        maxBytes -= bytesToCopy;
        KJ_DASSERT(minBytes >= 1);
        KJ_DASSERT(maxBytes >= minBytes);
      }

      return stream->tryRead(destination + bytesToCopy, minBytes, maxBytes)
          .then([bytesToCopy](size_t amount) { return amount + bytesToCopy; });
    }
  }